

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_hash.c
# Opt level: O0

void lyd_unlink_hash(lyd_node *node)

{
  char *pcVar1;
  LY_ERR LVar2;
  uint32_t uVar3;
  size_t sVar4;
  ly_ctx *local_48;
  ly_ctx *local_40;
  ly_ctx *local_20;
  lyd_node *plStack_10;
  uint32_t hash;
  lyd_node *node_local;
  
  if ((((node->parent != (lyd_node_inner *)0x0) && (node->schema != (lysc_node *)0x0)) &&
      ((node->parent->field_0).node.schema != (lysc_node *)0x0)) &&
     (node->parent->children_ht != (ly_ht *)0x0)) {
    plStack_10 = node;
    LVar2 = lyht_remove(node->parent->children_ht,&stack0xfffffffffffffff0,node->hash);
    if (LVar2 == LY_SUCCESS) {
      if (((plStack_10->schema->nodetype & 0x18) != 0) &&
         ((plStack_10->prev->next == (lyd_node *)0x0 ||
          (plStack_10->prev->schema != plStack_10->schema)))) {
        pcVar1 = plStack_10->schema->module->name;
        sVar4 = strlen(plStack_10->schema->module->name);
        uVar3 = lyht_hash_multi(0,pcVar1,sVar4);
        pcVar1 = plStack_10->schema->name;
        sVar4 = strlen(plStack_10->schema->name);
        uVar3 = lyht_hash_multi(uVar3,pcVar1,sVar4);
        uVar3 = lyht_hash_multi(uVar3,(char *)0x0,0);
        LVar2 = lyht_remove(plStack_10->parent->children_ht,&stack0xfffffffffffffff0,uVar3);
        if (LVar2 == LY_SUCCESS) {
          if (((plStack_10->next != (lyd_node *)0x0) &&
              (plStack_10->next->schema == plStack_10->schema)) &&
             (LVar2 = lyht_insert(plStack_10->parent->children_ht,&plStack_10->next,uVar3,
                                  (void **)0x0), LVar2 != LY_SUCCESS)) {
            if (plStack_10->schema == (lysc_node *)0x0) {
              local_48 = (ly_ctx *)plStack_10[2].schema;
            }
            else {
              local_48 = plStack_10->schema->module->ctx;
            }
            ly_log(local_48,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
                   ,0xe7);
          }
        }
        else {
          if (plStack_10->schema == (lysc_node *)0x0) {
            local_40 = (ly_ctx *)plStack_10[2].schema;
          }
          else {
            local_40 = plStack_10->schema->module->ctx;
          }
          ly_log(local_40,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
                 ,0xe0);
        }
      }
    }
    else {
      if (plStack_10->schema == (lysc_node *)0x0) {
        local_20 = (ly_ctx *)plStack_10[2].schema;
      }
      else {
        local_20 = plStack_10->schema->module->ctx;
      }
      ly_log(local_20,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_hash.c"
             ,0xd3);
    }
  }
  return;
}

Assistant:

void
lyd_unlink_hash(struct lyd_node *node)
{
    uint32_t hash;

    if (!node->parent || !node->schema || !node->parent->schema || !node->parent->children_ht) {
        /* not in any HT */
        return;
    }

    /* remove from the parent HT */
    if (lyht_remove(node->parent->children_ht, &node, node->hash)) {
        LOGINT(LYD_CTX(node));
        return;
    }

    /* first instance of the (leaf-)list, needs to be removed from HT */
    if ((node->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) && (!node->prev->next || (node->prev->schema != node->schema))) {
        /* get the simple hash */
        hash = lyht_hash_multi(0, node->schema->module->name, strlen(node->schema->module->name));
        hash = lyht_hash_multi(hash, node->schema->name, strlen(node->schema->name));
        hash = lyht_hash_multi(hash, NULL, 0);

        /* remove the instance */
        if (lyht_remove(node->parent->children_ht, &node, hash)) {
            LOGINT(LYD_CTX(node));
            return;
        }

        /* add the next instance */
        if (node->next && (node->next->schema == node->schema)) {
            if (lyht_insert(node->parent->children_ht, &node->next, hash, NULL)) {
                LOGINT(LYD_CTX(node));
                return;
            }
        }
    }
}